

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

void WebPSamplerProcessPlane
               (uint8_t *y,int y_stride,uint8_t *u,uint8_t *v,int uv_stride,uint8_t *dst,
               int dst_stride,int width,int height,WebPSamplerRowFunc func)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (height < 1) {
    height = uVar2;
  }
  for (; height != uVar2; uVar2 = uVar2 + 1) {
    (*func)(y,u,v,dst,width);
    y = y + y_stride;
    uVar1 = -(uVar2 & 1) & uv_stride;
    v = v + (int)uVar1;
    u = u + (int)uVar1;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

void WebPSamplerProcessPlane(const uint8_t* WEBP_RESTRICT y, int y_stride,
                             const uint8_t* WEBP_RESTRICT u,
                             const uint8_t* WEBP_RESTRICT v, int uv_stride,
                             uint8_t* WEBP_RESTRICT dst, int dst_stride,
                             int width, int height, WebPSamplerRowFunc func) {
  int j;
  for (j = 0; j < height; ++j) {
    func(y, u, v, dst, width);
    y += y_stride;
    if (j & 1) {
      u += uv_stride;
      v += uv_stride;
    }
    dst += dst_stride;
  }
}